

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsImageElement.cpp
# Opt level: O0

void __thiscall KDReports::ImageElement::ImageElement(ImageElement *this,QImage *image)

{
  ImageElementPrivate *this_00;
  QImage *image_local;
  ImageElement *this_local;
  
  Element::Element(&this->super_Element);
  (this->super_Element)._vptr_Element = (_func_int **)&PTR__ImageElement_001c8318;
  this_00 = (ImageElementPrivate *)operator_new(0x58);
  ImageElementPrivate::ImageElementPrivate(this_00);
  std::
  unique_ptr<KDReports::ImageElementPrivate,std::default_delete<KDReports::ImageElementPrivate>>::
  unique_ptr<std::default_delete<KDReports::ImageElementPrivate>,void>
            ((unique_ptr<KDReports::ImageElementPrivate,std::default_delete<KDReports::ImageElementPrivate>>
              *)&this->d,this_00);
  setImage(this,image);
  return;
}

Assistant:

KDReports::ImageElement::ImageElement(const QImage &image)
    : d(new ImageElementPrivate)
{
    setImage(image);
}